

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

void __thiscall
icu_63::UnicodeString::UnicodeString(UnicodeString *this,int32_t capacity,UChar32 c,int32_t count)

{
  ushort uVar1;
  uint uVar2;
  UBool UVar3;
  char16_t *pcVar4;
  ulong uVar5;
  
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_003b5258
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 0;
  if ((uint)c < 0x110000 && 0 < count) {
    if (c < 0x10000) {
      if (capacity <= count) {
        capacity = count;
      }
      UVar3 = allocate(this,capacity);
      if (UVar3 == '\0') {
        return;
      }
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        pcVar4 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar4 = (char16_t *)((long)&this->fUnion + 2);
      }
      if (0 < count) {
        uVar5 = 0;
        do {
          pcVar4[uVar5] = (char16_t)c;
          uVar5 = uVar5 + 1;
        } while ((uint)count != uVar5);
      }
      uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
      if (count < 0x400) {
        (this->fUnion).fStackFields.fLengthAndFlags = (ushort)(count << 5) | uVar1 & 0x1f;
        return;
      }
      (this->fUnion).fStackFields.fLengthAndFlags = uVar1 | 0xffe0;
      (this->fUnion).fFields.fLength = count;
      return;
    }
    if (count < 0x40000000) {
      uVar2 = count * 2;
      if (capacity < (int)uVar2) {
        capacity = uVar2;
      }
      UVar3 = allocate(this,capacity);
      if (UVar3 == '\0') {
        return;
      }
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        pcVar4 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar4 = (char16_t *)((long)&this->fUnion + 2);
      }
      if (count != 0) {
        uVar5 = 0;
        do {
          pcVar4[uVar5] = (short)((uint)c >> 10) + L'ퟀ';
          pcVar4[uVar5 + 1] = (char16_t)c & 0x3ffU | 0xdc00;
          uVar5 = uVar5 + 2;
        } while (uVar5 < uVar2);
      }
      uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
      if ((uint)count < 0x200) {
        (this->fUnion).fStackFields.fLengthAndFlags = (ushort)(count << 6) | uVar1 & 0x1f;
        return;
      }
      (this->fUnion).fStackFields.fLengthAndFlags = uVar1 | 0xffe0;
      (this->fUnion).fFields.fLength = uVar2;
      return;
    }
  }
  allocate(this,capacity);
  return;
}

Assistant:

UnicodeString::UnicodeString(int32_t capacity, UChar32 c, int32_t count) {
  fUnion.fFields.fLengthAndFlags = 0;
  if(count <= 0 || (uint32_t)c > 0x10ffff) {
    // just allocate and do not do anything else
    allocate(capacity);
  } else if(c <= 0xffff) {
    int32_t length = count;
    if(capacity < length) {
      capacity = length;
    }
    if(allocate(capacity)) {
      UChar *array = getArrayStart();
      UChar unit = (UChar)c;
      for(int32_t i = 0; i < length; ++i) {
        array[i] = unit;
      }
      setLength(length);
    }
  } else {  // supplementary code point, write surrogate pairs
    if(count > (INT32_MAX / 2)) {
      // We would get more than 2G UChars.
      allocate(capacity);
      return;
    }
    int32_t length = count * 2;
    if(capacity < length) {
      capacity = length;
    }
    if(allocate(capacity)) {
      UChar *array = getArrayStart();
      UChar lead = U16_LEAD(c);
      UChar trail = U16_TRAIL(c);
      for(int32_t i = 0; i < length; i += 2) {
        array[i] = lead;
        array[i + 1] = trail;
      }
      setLength(length);
    }
  }
}